

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::RandomBernoulliStaticLayerParams::InternalSwap
          (RandomBernoulliStaticLayerParams *this,RandomBernoulliStaticLayerParams *other)

{
  float fVar1;
  intptr_t iVar2;
  int64_t iVar3;
  void *pvVar4;
  void *pvVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  LogMessage *other_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  iVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  (this->super_MessageLite)._internal_metadata_.ptr_ =
       (other->super_MessageLite)._internal_metadata_.ptr_;
  (other->super_MessageLite)._internal_metadata_.ptr_ = iVar2;
  if (this == other) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x324);
    other_00 = google::protobuf::internal::LogMessage::operator<<
                         (&local_50,"CHECK failed: this != other: ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other_00);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  iVar7 = (this->outputshape_).current_size_;
  iVar8 = (this->outputshape_).total_size_;
  pvVar4 = (this->outputshape_).arena_or_elements_;
  iVar6 = (other->outputshape_).total_size_;
  pvVar5 = (other->outputshape_).arena_or_elements_;
  (this->outputshape_).current_size_ = (other->outputshape_).current_size_;
  (this->outputshape_).total_size_ = iVar6;
  (this->outputshape_).arena_or_elements_ = pvVar5;
  (other->outputshape_).current_size_ = iVar7;
  (other->outputshape_).total_size_ = iVar8;
  (other->outputshape_).arena_or_elements_ = pvVar4;
  iVar3 = this->seed_;
  this->seed_ = other->seed_;
  other->seed_ = iVar3;
  fVar1 = this->prob_;
  this->prob_ = other->prob_;
  other->prob_ = fVar1;
  return;
}

Assistant:

void RandomBernoulliStaticLayerParams::InternalSwap(RandomBernoulliStaticLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  outputshape_.InternalSwap(&other->outputshape_);
  ::PROTOBUF_NAMESPACE_ID::internal::memswap<
      PROTOBUF_FIELD_OFFSET(RandomBernoulliStaticLayerParams, prob_)
      + sizeof(RandomBernoulliStaticLayerParams::prob_)
      - PROTOBUF_FIELD_OFFSET(RandomBernoulliStaticLayerParams, seed_)>(
          reinterpret_cast<char*>(&seed_),
          reinterpret_cast<char*>(&other->seed_));
}